

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_send_text(telnet_t *telnet,char *buffer,size_t size)

{
  char cVar1;
  size_t sVar2;
  char *buffer_00;
  long lVar3;
  
  lVar3 = 0;
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    cVar1 = buffer[sVar2];
    if (cVar1 == -1) {
      if (sVar2 - lVar3 != 0) {
        _send(telnet,buffer + lVar3,sVar2 - lVar3);
      }
      lVar3 = sVar2 + 1;
      telnet_iac(telnet,0xff);
    }
    else if (((telnet->flags & 0x20) == 0) && ((cVar1 == '\r' || (cVar1 == '\n')))) {
      if (sVar2 - lVar3 != 0) {
        _send(telnet,buffer + lVar3,sVar2 - lVar3);
        cVar1 = buffer[sVar2];
      }
      lVar3 = sVar2 + 1;
      if (cVar1 == '\r') {
        buffer_00 = "\r";
      }
      else {
        buffer_00 = "\r\n";
      }
      _send(telnet,buffer_00,2);
    }
  }
  if (size - lVar3 == 0) {
    return;
  }
  _send(telnet,buffer + lVar3,size - lVar3);
  return;
}

Assistant:

void telnet_send_text(telnet_t *telnet, const char *buffer,
		size_t size) {
	size_t i, l;

	for (l = i = 0; i != size; ++i) {
		/* dump prior portion of text, send escaped bytes */
		if (buffer[i] == (char)TELNET_IAC) {
			/* dump prior text if any */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* send escape */
			telnet_iac(telnet, TELNET_IAC);
		}
		/* special characters if not in BINARY mode */
		else if (!(telnet->flags & TELNET_FLAG_TRANSMIT_BINARY) &&
				 (buffer[i] == '\r' || buffer[i] == '\n')) {
			/* dump prior portion of text */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* automatic translation of \r -> CRNUL */
			if (buffer[i] == '\r') {
				_send(telnet, CRNUL, 2);
			}
			/* automatic translation of \n -> CRLF */
			else {
				_send(telnet, CRLF, 2);
			}
		}
	}

	/* send whatever portion of buffer is left */
	if (i != l) {
		_send(telnet, buffer + l, i - l);
	}
}